

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O2

int libssh2_userauth_keyboard_interactive_ex
              (LIBSSH2_SESSION *session,char *user,uint user_len,
              _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
              *response_callback)

{
  uint uVar1;
  int iVar2;
  time_t start_time;
  uchar *puVar3;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar4;
  LIBSSH2_USERAUTH_KBDINT_RESPONSE *pLVar5;
  size_t sVar6;
  char *pcVar7;
  LIBSSH2_USERAUTH_KBDINT_PROMPT *pLVar8;
  ulong uVar9;
  long lVar10;
  uchar *local_68;
  LIBSSH2_USERAUTH_KBDINT_PROMPT **local_60;
  _func_void_char_ptr_int_char_ptr_int_int_LIBSSH2_USERAUTH_KBDINT_PROMPT_ptr_LIBSSH2_USERAUTH_KBDINT_RESPONSE_ptr_void_ptr_ptr
  *local_58;
  ulong local_50;
  char *local_48;
  size_t local_40;
  packet_requirev_state_t *local_38;
  
  local_58 = response_callback;
  local_48 = user;
  start_time = time((time_t *)0x0);
  local_60 = &session->userauth_kybd_prompts;
  local_40 = (size_t)(user_len + 0x37);
  local_38 = &session->userauth_kybd_packet_requirev_state;
  local_50 = (ulong)user_len;
LAB_00128481:
  switch(session->userauth_kybd_state) {
  case libssh2_NB_state_idle:
    session->userauth_kybd_auth_name = (uchar *)0x0;
    session->userauth_kybd_auth_instruction = (uchar *)0x0;
    session->userauth_kybd_num_prompts = 0;
    session->userauth_kybd_auth_failure = 1;
    *local_60 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    local_60[1] = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
    ((packet_requirev_state_t *)(local_60 + 2))->start = 0;
    session->userauth_kybd_packet_len = local_40;
    puVar3 = (uchar *)(*session->alloc)(local_40,&session->abstract);
    session->userauth_kybd_data = puVar3;
    if (puVar3 != (uchar *)0x0) {
      local_68 = puVar3 + 1;
      *puVar3 = '2';
      _libssh2_store_str(&local_68,local_48,local_50);
      _libssh2_store_str(&local_68,"ssh-connection",0xe);
      _libssh2_store_str(&local_68,"keyboard-interactive",0x14);
      _libssh2_store_u32(&local_68,0);
      _libssh2_store_u32(&local_68,0);
      session->userauth_kybd_state = libssh2_NB_state_created;
      goto switchD_0012849f_caseD_2;
    }
    iVar2 = -6;
    pcVar7 = "Unable to allocate memory for keyboard-interactive authentication";
    break;
  default:
    goto switchD_0012849f_caseD_1;
  case libssh2_NB_state_created:
switchD_0012849f_caseD_2:
    iVar2 = _libssh2_transport_send
                      (session,session->userauth_kybd_data,session->userauth_kybd_packet_len,
                       (uchar *)0x0,0);
    if (iVar2 == 0) {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      do {
        session->userauth_kybd_state = libssh2_NB_state_sent;
switchD_0012849f_caseD_3:
        iVar2 = _libssh2_packet_requirev
                          (session,"43<",&session->userauth_kybd_data,
                           &session->userauth_kybd_data_len,0,(uchar *)0x0,0,local_38);
        if (iVar2 != 0) {
          if (iVar2 == -0x25) goto LAB_001288da;
LAB_001287eb:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          iVar2 = -0x12;
          pcVar7 = "Waiting for keyboard USERAUTH response";
          goto LAB_001288e7;
        }
        if (session->userauth_kybd_data_len == 0) goto LAB_001287eb;
        puVar3 = session->userauth_kybd_data;
        if (*puVar3 == '3') goto LAB_00128804;
        if (*puVar3 == '4') {
          (*session->free)(puVar3,&session->abstract);
          session->userauth_kybd_data = (uchar *)0x0;
          *(byte *)&session->state = (byte)session->state | 4;
          iVar2 = 0;
          goto LAB_0012893a;
        }
        iVar2 = userauth_keyboard_interactive_decode_info_request(session);
        if (-1 < iVar2) {
          (*local_58)((char *)session->userauth_kybd_auth_name,
                      (int)session->userauth_kybd_auth_name_len,
                      (char *)session->userauth_kybd_auth_instruction,
                      (int)session->userauth_kybd_auth_instruction_len,
                      session->userauth_kybd_num_prompts,session->userauth_kybd_prompts,
                      session->userauth_kybd_responses,&session->abstract);
          session->userauth_kybd_packet_len = 5;
          sVar6 = 5;
          for (lVar10 = 0; (ulong)session->userauth_kybd_num_prompts << 4 != lVar10;
              lVar10 = lVar10 + 0x10) {
            uVar1 = *(uint *)((long)&session->userauth_kybd_responses->length + lVar10);
            if (-sVar6 - 5 < (ulong)uVar1) goto LAB_0012889d;
            sVar6 = sVar6 + (uVar1 + 4);
            session->userauth_kybd_packet_len = sVar6;
          }
          (*session->free)(session->userauth_kybd_data,&session->abstract);
          local_68 = (uchar *)(*session->alloc)(session->userauth_kybd_packet_len,&session->abstract
                                               );
          session->userauth_kybd_data = local_68;
          if (local_68 == (uchar *)0x0) {
LAB_0012889d:
            iVar2 = -6;
            pcVar7 = "Unable to allocate memory for keyboard-interactive response packet";
          }
          else {
            *local_68 = '=';
            local_68 = local_68 + 1;
            _libssh2_store_u32(&local_68,session->userauth_kybd_num_prompts);
            lVar10 = 8;
            for (uVar9 = 0; uVar9 < session->userauth_kybd_num_prompts; uVar9 = uVar9 + 1) {
              _libssh2_store_str(&local_68,
                                 *(char **)((long)session->userauth_kybd_responses + lVar10 + -8),
                                 (ulong)*(uint *)((long)&session->userauth_kybd_responses->text +
                                                 lVar10));
              lVar10 = lVar10 + 0x10;
            }
            session->userauth_kybd_state = libssh2_NB_state_sent1;
switchD_0012849f_caseD_4:
            iVar2 = _libssh2_transport_send
                              (session,session->userauth_kybd_data,session->userauth_kybd_packet_len
                               ,(uchar *)0x0,0);
            if (iVar2 == 0) {
              session->userauth_kybd_auth_failure = 0;
              goto switchD_0012849f_caseD_1;
            }
            if (iVar2 == -0x25) goto LAB_001288da;
            iVar2 = -7;
            pcVar7 = "Unable to send userauth-keyboard-interactive request";
          }
          _libssh2_error(session,iVar2,pcVar7);
        }
switchD_0012849f_caseD_1:
        (*session->free)(session->userauth_kybd_data,&session->abstract);
        session->userauth_kybd_data = (uchar *)0x0;
        pLVar4 = session->userauth_kybd_prompts;
        pLVar8 = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
        if (pLVar4 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          lVar10 = 0;
          for (uVar9 = 0; pLVar8 = pLVar4, uVar9 < session->userauth_kybd_num_prompts;
              uVar9 = uVar9 + 1) {
            (*session->free)(*(void **)((long)&pLVar4->text + lVar10),&session->abstract);
            pLVar4 = session->userauth_kybd_prompts;
            *(undefined8 *)((long)&pLVar4->text + lVar10) = 0;
            lVar10 = lVar10 + 0x18;
          }
        }
        pLVar5 = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        if (session->userauth_kybd_responses != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          lVar10 = 0;
          pLVar5 = session->userauth_kybd_responses;
          for (uVar9 = 0; uVar9 < session->userauth_kybd_num_prompts; uVar9 = uVar9 + 1) {
            (*session->free)(*(void **)((long)&pLVar5->text + lVar10),&session->abstract);
            pLVar5 = session->userauth_kybd_responses;
            *(undefined8 *)((long)&pLVar5->text + lVar10) = 0;
            lVar10 = lVar10 + 0x10;
          }
          pLVar8 = *local_60;
        }
        if (pLVar8 != (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0) {
          (*session->free)(pLVar8,&session->abstract);
          session->userauth_kybd_prompts = (LIBSSH2_USERAUTH_KBDINT_PROMPT *)0x0;
          pLVar5 = session->userauth_kybd_responses;
        }
        if (pLVar5 != (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0) {
          (*session->free)(pLVar5,&session->abstract);
          session->userauth_kybd_responses = (LIBSSH2_USERAUTH_KBDINT_RESPONSE *)0x0;
        }
        if (session->userauth_kybd_auth_name != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_name,&session->abstract);
          session->userauth_kybd_auth_name = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_instruction != (uchar *)0x0) {
          (*session->free)(session->userauth_kybd_auth_instruction,&session->abstract);
          session->userauth_kybd_auth_instruction = (uchar *)0x0;
        }
        if (session->userauth_kybd_auth_failure != 0) {
          iVar2 = -1;
LAB_0012893a:
          session->userauth_kybd_state = libssh2_NB_state_idle;
          return iVar2;
        }
      } while( true );
    }
    if (iVar2 == -0x25) {
LAB_001288da:
      iVar2 = -0x25;
      pcVar7 = "Would block";
    }
    else {
      (*session->free)(session->userauth_kybd_data,&session->abstract);
      session->userauth_kybd_data = (uchar *)0x0;
      session->userauth_kybd_state = libssh2_NB_state_idle;
      iVar2 = -7;
      pcVar7 = "Unable to send keyboard-interactive request";
    }
    break;
  case libssh2_NB_state_sent:
    goto switchD_0012849f_caseD_3;
  case libssh2_NB_state_sent1:
    goto switchD_0012849f_caseD_4;
  }
  goto LAB_001288e7;
LAB_00128804:
  (*session->free)(puVar3,&session->abstract);
  session->userauth_kybd_data = (uchar *)0x0;
  session->userauth_kybd_state = libssh2_NB_state_idle;
  iVar2 = -0x12;
  pcVar7 = "Authentication failed (keyboard-interactive)";
LAB_001288e7:
  iVar2 = _libssh2_error(session,iVar2,pcVar7);
  if (iVar2 != -0x25) {
    return iVar2;
  }
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar2 = _libssh2_wait_socket(session,start_time);
  if (iVar2 != 0) {
    return iVar2;
  }
  goto LAB_00128481;
}

Assistant:

LIBSSH2_API int
libssh2_userauth_keyboard_interactive_ex(LIBSSH2_SESSION *session,
                                         const char *user,
                                         unsigned int user_len,
                                         LIBSSH2_USERAUTH_KBDINT_RESPONSE_FUNC
                                             ((*response_callback)))
{
    int rc;
    BLOCK_ADJUST(rc, session,
                 userauth_keyboard_interactive(session, user, user_len,
                                               response_callback));
    return rc;
}